

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumns *pIVar1;
  ImGuiColumnData *pIVar2;
  int iVar3;
  float fVar4;
  ImVec2 IVar5;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 == (ImGuiColumns *)0x0) {
    IVar5 = GetContentRegionAvail();
    fVar4 = IVar5.x;
  }
  else {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    iVar3 = (pIVar1->Columns).Size;
    if (iVar3 <= column_index + 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      iVar3 = (pIVar1->Columns).Size;
    }
    pIVar2 = (pIVar1->Columns).Data;
    fVar4 = pIVar2[column_index + 1].OffsetNorm;
    if (iVar3 <= column_index) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      pIVar2 = (pIVar1->Columns).Data;
    }
    fVar4 = (pIVar1->OffMaxX - pIVar1->OffMinX) * (fVar4 - pIVar2[column_index].OffsetNorm);
  }
  return fVar4;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}